

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool IsJump(ParseNode *pnode)

{
  uint uVar1;
  ParseNodeStmt *pPVar2;
  ParseNode *pnode_local;
  
  uVar1 = (uint)pnode->nop;
  if ((7 < uVar1 - 0x5b) && (uVar1 != 100)) {
    if (uVar1 - 0x65 < 2) {
      return true;
    }
    if (3 < uVar1 - 0x67) {
      if (uVar1 == 0x6b) {
        return true;
      }
      if (uVar1 != 0x6c) {
        if (uVar1 == 0x6d) {
          return true;
        }
        if (1 < uVar1 - 0x6e) {
          return false;
        }
      }
    }
  }
  pPVar2 = ParseNode::AsParseNodeStmt(pnode);
  return (pPVar2->grfnop & 0x200) != 0;
}

Assistant:

bool IsJump(ParseNode *pnode)
{
    switch (pnode->nop)
    {
    case knopBreak:
    case knopContinue:
    case knopThrow:
    case knopReturn:
        return true;

    case knopBlock:
    case knopDoWhile:
    case knopWhile:
    case knopWith:
    case knopIf:
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
    case knopFor:
    case knopSwitch:
    case knopCase:
    case knopTryFinally:
    case knopTryCatch:
    case knopTry:
    case knopCatch:
    case knopFinally:
        return (pnode->AsParseNodeStmt()->grfnop & fnopJump) != 0;

    default:
        return false;
    }
}